

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

void Gia_ManSeqEquivMerge(Gia_Man_t *p,Gia_Man_t **pPart)

{
  uint *puVar1;
  size_t __size;
  int iVar2;
  Gia_Man_t *pGVar3;
  Gia_Obj_t *pGVar4;
  bool bVar5;
  undefined4 *__s;
  void *__s_00;
  Gia_Rpr_t *pGVar6;
  long lVar7;
  ulong uVar8;
  int *piVar9;
  bool bVar10;
  bool bVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  Gia_Rpr_t *pGVar15;
  ulong uVar16;
  ulong uVar17;
  
  uVar12 = p->nObjs;
  uVar16 = (ulong)uVar12;
  __size = (long)(int)uVar12 * 4;
  __s = (undefined4 *)malloc(__size);
  memset(__s,0xff,__size);
  __s_00 = malloc(__size);
  memset(__s_00,0xff,__size);
  if ((p->pReprs != (Gia_Rpr_t *)0x0) || (p->pNexts != (int *)0x0)) {
    __assert_fail("p->pReprs == NULL && p->pNexts == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x127a,"void Gia_ManSeqEquivMerge(Gia_Man_t *, Gia_Man_t **)");
  }
  pGVar6 = (Gia_Rpr_t *)calloc((long)(int)uVar12,4);
  p->pReprs = pGVar6;
  if (0 < (int)uVar12) {
    lVar7 = 0;
    do {
      p->pReprs[lVar7] = (Gia_Rpr_t)((uint)p->pReprs[lVar7] | 0xfffffff);
      lVar7 = lVar7 + 1;
      uVar16 = (ulong)p->nObjs;
    } while (lVar7 < (long)uVar16);
  }
  uVar8 = uVar16 & 0xffffffff;
  *__s = 0;
  bVar11 = false;
  lVar7 = 0;
  bVar10 = true;
  do {
    pGVar3 = pPart[lVar7];
    pGVar6 = pGVar3->pReprs;
    if ((pGVar6 == (Gia_Rpr_t *)0x0) || (piVar9 = pGVar3->pNexts, piVar9 == (int *)0x0)) {
      __assert_fail("pPart[n]->pReprs != NULL && pPart[n]->pNexts != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                    ,0x1282,"void Gia_ManSeqEquivMerge(Gia_Man_t *, Gia_Man_t **)");
    }
    iVar2 = pGVar3->nObjs;
    uVar13 = (ulong)iVar2;
    if (0 < (long)uVar13) {
      lVar7 = 0;
      pGVar15 = pGVar6;
      do {
        if (((uint)*pGVar15 & 0xfffffff) == 0) {
          __s[*(uint *)((long)&pGVar3->pObjs->Value + lVar7)] = 0;
        }
        lVar7 = lVar7 + 0xc;
        pGVar15 = pGVar15 + 1;
      } while (uVar13 * 0xc != lVar7);
      if (iVar2 != 1) {
        uVar14 = 1;
        do {
          if (((~(uint)pGVar6[uVar14] & 0xfffffff) == 0) && (0 < piVar9[uVar14])) {
            pGVar4 = pGVar3->pObjs;
            uVar12 = pGVar4[uVar14].Value;
            if (bVar11) {
              uVar17 = uVar14 & 0xffffffff;
              do {
                if (iVar2 <= (int)uVar17) goto LAB_001f5f76;
                if (__s[pGVar4[uVar17].Value] != 0xffffffff) {
                  uVar12 = __s[pGVar4[uVar17].Value];
                }
                puVar1 = (uint *)(piVar9 + uVar17);
                uVar17 = (ulong)*puVar1;
              } while (0 < (int)*puVar1);
            }
            uVar17 = uVar14 & 0xffffffff;
            do {
              if (iVar2 <= (int)uVar17) {
LAB_001f5f76:
                __assert_fail("v >= 0 && v < p->nObjs",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                              ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
              }
              __s[pGVar4[uVar17].Value] = uVar12;
              puVar1 = (uint *)(piVar9 + uVar17);
              uVar17 = (ulong)*puVar1;
            } while (0 < (int)*puVar1);
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 != uVar13);
      }
    }
    lVar7 = 1;
    bVar11 = true;
    bVar5 = !bVar10;
    bVar10 = false;
    if (bVar5) {
      if (0 < (int)uVar16) {
        uVar13 = 0;
        do {
          lVar7 = (long)(int)__s[uVar13];
          if ((lVar7 != -1) && (*(int *)((long)__s_00 + lVar7 * 4) == -1)) {
            *(int *)((long)__s_00 + lVar7 * 4) = (int)uVar13;
            __s[uVar13] = 0xffffffff;
          }
          uVar13 = uVar13 + 1;
        } while (uVar8 != uVar13);
        if (0 < (int)uVar16) {
          lVar7 = 0;
          do {
            if ((long)(int)__s[lVar7] != -1) {
              p->pReprs[lVar7] =
                   (Gia_Rpr_t)
                   ((uint)p->pReprs[lVar7] & 0xf0000000 |
                   *(uint *)((long)__s_00 + (long)(int)__s[lVar7] * 4) & 0xfffffff);
              uVar8 = (ulong)(uint)p->nObjs;
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 < (int)uVar8);
        }
      }
      free(__s);
      if (__s_00 != (void *)0x0) {
        free(__s_00);
      }
      piVar9 = Gia_ManDeriveNexts(p);
      p->pNexts = piVar9;
      return;
    }
  } while( true );
}

Assistant:

void Gia_ManSeqEquivMerge( Gia_Man_t * p, Gia_Man_t * pPart[2] )
{
    int i, iObj, * pClasses    = ABC_FALLOC( int, Gia_ManObjNum(p) );
    int n, Repr, * pClass2Repr = ABC_FALLOC( int, Gia_ManObjNum(p) );
    // initialize equiv class representation in the big AIG
    assert( p->pReprs  == NULL && p->pNexts  == NULL );
    p->pReprs = ABC_CALLOC( Gia_Rpr_t, Gia_ManObjNum(p) );
    for ( i = 0; i < Gia_ManObjNum(p); i++ )
        Gia_ObjSetRepr( p, i, GIA_VOID );
    // map equivalences of p into classes
    pClasses[0] = 0;
    for ( n = 0; n < 2; n++ )
    {
        assert( pPart[n]->pReprs != NULL && pPart[n]->pNexts != NULL );
        for ( i = 0; i < Gia_ManObjNum(pPart[n]); i++ )
            if ( Gia_ObjRepr(pPart[n], i) == 0 )
                pClasses[Gia_ManObj(pPart[n], i)->Value] = 0;
        Gia_ManForEachClass( pPart[n], i )
        {
            Repr = Gia_ManObj(pPart[n], i)->Value;
            if ( n == 1 )
            {
                Gia_ClassForEachObj( pPart[n], i, iObj )
                    if ( pClasses[Gia_ManObj(pPart[n], iObj)->Value] != -1 )
                        Repr = pClasses[Gia_ManObj(pPart[n], iObj)->Value];
            }
            Gia_ClassForEachObj( pPart[n], i, iObj )
                pClasses[Gia_ManObj(pPart[n], iObj)->Value] = Repr;
        }
    }
    // map representatives of each class
    for ( i = 0; i < Gia_ManObjNum(p); i++ )
        if ( pClasses[i] != -1 && pClass2Repr[pClasses[i]] == -1 )
        {
            pClass2Repr[pClasses[i]] = i;
            pClasses[i] = -1;
        }
    // remap the remaining classes
    for ( i = 0; i < Gia_ManObjNum(p); i++ )
        if ( pClasses[i] != -1 )
            p->pReprs[i].iRepr = pClass2Repr[pClasses[i]];
    ABC_FREE(pClasses);
    ABC_FREE(pClass2Repr);
    // create next pointers
    p->pNexts = Gia_ManDeriveNexts( p );
}